

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O0

ConstPixelBufferAccess * __thiscall
vkt::drawutil::ReferenceDrawContext::getColorPixels
          (ConstPixelBufferAccess *__return_storage_ptr__,ReferenceDrawContext *this)

{
  int width;
  int height;
  int depth;
  TextureFormat *format;
  void *data;
  ConstPixelBufferAccess local_e0;
  ConstPixelBufferAccess local_b8;
  ConstPixelBufferAccess local_90;
  ConstPixelBufferAccess local_68;
  ConstPixelBufferAccess local_40;
  ReferenceDrawContext *local_18;
  ReferenceDrawContext *this_local;
  
  local_18 = this;
  this_local = (ReferenceDrawContext *)__return_storage_ptr__;
  tcu::TextureLevel::getAccess(&local_40,&this->m_refImage);
  format = tcu::ConstPixelBufferAccess::getFormat(&local_40);
  tcu::TextureLevel::getAccess(&local_68,&this->m_refImage);
  width = tcu::ConstPixelBufferAccess::getWidth(&local_68);
  tcu::TextureLevel::getAccess(&local_90,&this->m_refImage);
  height = tcu::ConstPixelBufferAccess::getHeight(&local_90);
  tcu::TextureLevel::getAccess(&local_b8,&this->m_refImage);
  depth = tcu::ConstPixelBufferAccess::getDepth(&local_b8);
  tcu::TextureLevel::getAccess(&local_e0,&this->m_refImage);
  data = tcu::ConstPixelBufferAccess::getDataPtr(&local_e0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,width,height,depth,data);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess ReferenceDrawContext::getColorPixels (void) const
{
	return tcu::ConstPixelBufferAccess( m_refImage.getAccess().getFormat(),
										m_refImage.getAccess().getWidth(),
										m_refImage.getAccess().getHeight(),
										m_refImage.getAccess().getDepth(),
										m_refImage.getAccess().getDataPtr());
}